

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mzd_additional.c
# Opt level: O1

void mzd_addmul_v_uint64_128(mzd_local_t *c,mzd_local_t *v,mzd_local_t *A)

{
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  uint w;
  int iVar5;
  long lVar6;
  word wVar7;
  ulong uVar8;
  
  uVar2 = c->w64[0];
  uVar3 = c->w64[1];
  iVar5 = 2;
  do {
    wVar7 = v->w64[0];
    lVar1 = 0;
    do {
      lVar6 = lVar1;
      uVar8 = -(ulong)((uint)wVar7 & 1);
      uVar4 = (long)(wVar7 << 0x3e) >> 0x3f;
      uVar2 = uVar2 ^ *(ulong *)((long)A->w64 + lVar6 + 0x10) & uVar4 ^
                      *(ulong *)((long)A->w64 + lVar6) & uVar8;
      c->w64[0] = uVar2;
      uVar3 = uVar3 ^ uVar4 & *(ulong *)((long)A->w64 + lVar6 + 0x18) ^
                      uVar8 & *(ulong *)((long)A->w64 + lVar6 + 8);
      c->w64[1] = uVar3;
      wVar7 = wVar7 >> 2;
      lVar1 = lVar6 + 0x20;
    } while ((int)(lVar6 + 0x20) != 0x400);
    v = (mzd_local_t *)((long)v + 8);
    A = (mzd_local_t *)((long)A[1].w64 + lVar6);
    iVar5 = iVar5 + -1;
  } while (iVar5 != 0);
  return;
}

Assistant:

void mzd_addmul_v_uint64_128(mzd_local_t* c, mzd_local_t const* v, mzd_local_t const* A) {
  block_t* cblock       = BLOCK(c, 0);
  const word* vptr      = CONST_BLOCK(v, 0)->w64;
  const block_t* Ablock = CONST_BLOCK(A, 0);

  for (unsigned int w = 2; w; --w, ++vptr) {
    word idx = *vptr;
    for (unsigned int i = sizeof(word) * 8; i; i -= 2, idx >>= 2, Ablock += 1) {
      const word mask1 = -(idx & 1);
      const word mask2 = -((idx >> 1) & 1);
      cblock->w64[0] ^= (Ablock->w64[0] & mask1) ^ (Ablock->w64[2] & mask2);
      cblock->w64[1] ^= (Ablock->w64[1] & mask1) ^ (Ablock->w64[3] & mask2);
    }
  }
}